

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextVkImpl::CommitScissorRects(DeviceContextVkImpl *this)

{
  VkOffset2D VVar1;
  bool bVar2;
  PipelineStateVkImpl *this_00;
  GraphicsPipelineDesc *pGVar3;
  Char *Message;
  VkExtent2D *pVVar4;
  Rect *SrcRect;
  undefined1 local_148 [4];
  Uint32 sr;
  VkRect2D VkScissorRects [16];
  undefined1 local_30 [8];
  string msg;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = this;
  bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                    ((RefCntAutoPtr *)
                     &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
  if (bVar2) {
    this_00 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                        (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
    pGVar3 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                       (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if (((pGVar3->RasterizerDesc).ScissorEnable & 1U) != 0) goto LAB_003aac6b;
  }
  FormatString<char[54]>
            ((string *)local_30,
             (char (*) [54])"Scissor test must be enabled in the graphics pipeline");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"CommitScissorRects",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
             ,0x6d6);
  std::__cxx11::string::~string((string *)local_30);
LAB_003aac6b:
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumScissorRects != 0) {
    for (SrcRect._4_4_ = 0;
        SrcRect._4_4_ <
        (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumScissorRects;
        SrcRect._4_4_ = SrcRect._4_4_ + 1) {
      pVVar4 = (VkExtent2D *)
               ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScissorRects + SrcRect._4_4_
               );
      VkScissorRects[(ulong)SrcRect._4_4_ - 1].extent = *pVVar4;
      VVar1.y = pVVar4[1].height - pVVar4->height;
      VVar1.x = pVVar4[1].width - pVVar4->width;
      VkScissorRects[SrcRect._4_4_].offset = VVar1;
    }
    EnsureVkCmdBuffer(this);
    VulkanUtilities::VulkanCommandBuffer::SetScissorRects
              (&this->m_CommandBuffer,0,
               (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumScissorRects,
               (VkRect2D *)local_148);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CommitScissorRects()
{
    VERIFY(m_pPipelineState && m_pPipelineState->GetGraphicsPipelineDesc().RasterizerDesc.ScissorEnable, "Scissor test must be enabled in the graphics pipeline");

    if (m_NumScissorRects == 0)
        return; // Scissors have not been set in the context yet

    VkRect2D VkScissorRects[MAX_VIEWPORTS]; // Do not waste time initializing array with zeroes
    for (Uint32 sr = 0; sr < m_NumScissorRects; ++sr)
    {
        const Rect& SrcRect       = m_ScissorRects[sr];
        VkScissorRects[sr].offset = {SrcRect.left, SrcRect.top};
        VkScissorRects[sr].extent = {static_cast<uint32_t>(SrcRect.right - SrcRect.left), static_cast<uint32_t>(SrcRect.bottom - SrcRect.top)};
    }

    EnsureVkCmdBuffer();
    // TODO: reinterpret_cast m_Viewports to m_Viewports?
    m_CommandBuffer.SetScissorRects(0, m_NumScissorRects, VkScissorRects);
}